

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O2

Box3f * anon_unknown.dwarf_364dc::transformSimple(Box3f *__return_storage_ptr__,Box3f *b,M44f *M)

{
  int j;
  long lVar1;
  Box3f *pBVar2;
  int i;
  uint uVar3;
  V3f p;
  Vec3<float> local_48;
  Vec3<float> local_3c;
  
  (__return_storage_ptr__->min).x = 3.4028235e+38;
  (__return_storage_ptr__->min).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->min).z = 0xff7fffff7f7fffff;
  (__return_storage_ptr__->max).y = -3.4028235e+38;
  (__return_storage_ptr__->max).z = -3.4028235e+38;
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
      pBVar2 = (Box3f *)&b->max;
      if ((uVar3 >> ((uint)lVar1 & 0x1f) & 1) == 0) {
        pBVar2 = b;
      }
      (&local_48.x)[lVar1] = (&(pBVar2->min).x)[lVar1];
    }
    Imath_2_5::operator*(&local_48,M);
    Imath_2_5::Box<Imath_2_5::Vec3<float>_>::extendBy(__return_storage_ptr__,&local_3c);
  }
  return __return_storage_ptr__;
}

Assistant:

Box3f
transformSimple (const Box3f &b, const M44f &M)
{
    Box3f b1;

    for (int i = 0; i < 8; ++i)
    {
	V3f p;

	for (int j = 0; j < 3; ++j)
	    p[j] = ((i >> j) & 1)? b.max[j]: b.min[j];

	b1.extendBy (p * M);
    }

    return b1;
}